

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O0

string * duckdb::StrTimeFormat::ParseFormatSpecifier(string *format_string,StrTimeFormat *format)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  undefined8 uVar7;
  reference pvVar8;
  size_type sVar9;
  reference pvVar10;
  string *msg;
  string *in_RDX;
  StrTimeFormat *in_RSI;
  string *in_RDI;
  idx_t i_1;
  string error;
  StrfTimeFormat locale_format;
  string subformat;
  StrTimeSpecifier specifier;
  char format_char;
  idx_t i;
  string current_literal;
  idx_t pos;
  size_type in_stack_fffffffffffffc18;
  StrfTimeFormat *in_stack_fffffffffffffc20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc28;
  string *psVar11;
  StrTimeFormat *in_stack_fffffffffffffc30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  undefined4 in_stack_fffffffffffffcc0;
  char cVar12;
  undefined4 in_stack_fffffffffffffcc4;
  string local_2f0;
  string local_2d0 [32];
  string local_2b0 [39];
  allocator local_289;
  string local_288 [32];
  string local_268 [32];
  ulong local_248;
  string local_240 [39];
  undefined1 local_219;
  string local_218 [32];
  string local_1f8 [39];
  undefined1 local_1d1 [33];
  string local_1b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_> local_168 [6];
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [38];
  undefined1 local_8a;
  char local_89;
  string local_88 [32];
  undefined4 local_68;
  allocator local_61;
  ulong local_60;
  string local_58 [32];
  ulong local_38;
  StrTimeFormat *in_stack_ffffffffffffffe0;
  
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    ::std::__cxx11::string::operator=((string *)&in_RDX->_M_string_length,(string *)in_RSI);
    vector<duckdb::StrTimeSpecifier,_true>::clear
              ((vector<duckdb::StrTimeSpecifier,_true> *)0x13ebf8a);
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *)0x13ebf9b);
    vector<int,_true>::clear((vector<int,_true> *)0x13ebfac);
    *(undefined8 *)((long)&in_RDX[2].field_2 + 8) = 0;
    local_38 = 0;
    ::std::__cxx11::string::string(local_58);
    for (local_60 = 0; uVar1 = local_60, uVar2 = ::std::__cxx11::string::size(), uVar6 = local_38,
        uVar1 < uVar2; local_60 = local_60 + 1) {
      pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)in_RSI);
      if (*pcVar3 == '%') {
        lVar4 = local_60 + 1;
        lVar5 = ::std::__cxx11::string::size();
        if (lVar4 == lVar5) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)in_RDI,"Trailing format character %",&local_61);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_61);
          goto LAB_013eccac;
        }
        if (local_38 < local_60) {
          ::std::__cxx11::string::substr((ulong)local_88,(ulong)in_RSI);
          ::std::__cxx11::string::operator+=(local_58,local_88);
          ::std::__cxx11::string::~string(local_88);
        }
        local_60 = local_60 + 1;
        pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)in_RSI);
        local_89 = *pcVar3;
        if (local_89 == '%') {
          local_38 = local_60;
        }
        else {
          if ((local_89 == '-') &&
             (uVar1 = local_60 + 1, uVar6 = ::std::__cxx11::string::size(), uVar1 < uVar6)) {
            local_60 = local_60 + 1;
            pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)in_RSI);
            local_89 = *pcVar3;
            psVar11 = in_RDX;
            switch(local_89) {
            case 'H':
              local_8a = 0xd;
              break;
            case 'I':
              local_8a = 0xf;
              break;
            default:
              cVar12 = local_89;
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string(local_b0,1,cVar12,&local_b1);
              ::std::operator+((char *)in_stack_fffffffffffffc28,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffc20);
              ::std::__cxx11::string::~string(local_b0);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_b1);
              goto LAB_013eccac;
            case 'M':
              local_8a = 0x12;
              break;
            case 'S':
              local_8a = 0x14;
              break;
            case 'd':
              local_8a = 4;
              break;
            case 'j':
              local_8a = 0x1a;
              break;
            case 'm':
              local_8a = 8;
              break;
            case 'y':
              local_8a = 10;
            }
          }
          else {
            cVar12 = local_89;
            msg = (string *)(ulong)((int)local_89 - 0x41);
            psVar11 = in_RDX;
            switch(msg) {
            case (string *)0x0:
              local_8a = 1;
              break;
            case (string *)0x1:
              local_8a = 6;
              break;
            default:
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string(local_288,1,cVar12,&local_289);
              ::std::operator+((char *)in_stack_fffffffffffffc28,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffc20);
              ::std::__cxx11::string::~string(local_288);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_289);
              goto LAB_013eccac;
            case (string *)0x6:
              local_8a = 0x21;
              break;
            case (string *)0x7:
              local_8a = 0xc;
              break;
            case (string *)0x8:
              local_8a = 0xe;
              break;
            case (string *)0xc:
              local_8a = 0x11;
              break;
            case (string *)0x12:
              local_8a = 0x13;
              break;
            case (string *)0x13:
            case (string *)0x17:
            case (string *)0x22:
            case (string *)0x37:
              ::std::__cxx11::string::string(local_d8);
              if (local_89 == 'c') {
                ::std::__cxx11::string::operator=(local_d8,"%Y-%m-%d %H:%M:%S");
              }
              else if (local_89 == 'x') {
                ::std::__cxx11::string::operator=(local_d8,"%Y-%m-%d");
              }
              else if ((local_89 == 'X') || (local_89 == 'T')) {
                ::std::__cxx11::string::operator=(local_d8,"%H:%M:%S");
              }
              params = &local_190;
              StrfTimeFormat::StrfTimeFormat(in_stack_fffffffffffffc20);
              ParseFormatSpecifier(in_RDX,in_stack_ffffffffffffffe0);
              uVar1 = ::std::__cxx11::string::empty();
              if ((uVar1 & 1) == 0) {
                local_219 = 1;
                uVar7 = __cxa_allocate_exception(0x10);
                params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1d1;
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          ((string *)(local_1d1 + 1),
                           "Failed to bind sub-format specifier \"%s\": %s",(allocator *)params_1);
                ::std::__cxx11::string::string(local_1f8,local_d8);
                ::std::__cxx11::string::string(local_218,local_1b0);
                InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                          ((InternalException *)
                           CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),msg,params,
                           params_1);
                local_219 = 0;
                __cxa_throw(uVar7,&InternalException::typeinfo,InternalException::~InternalException
                           );
              }
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
              ::std::operator+(in_stack_fffffffffffffc28,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffc20);
              pvVar8 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                     *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
              ::std::__cxx11::string::operator=((string *)pvVar8,local_240);
              ::std::__cxx11::string::~string(local_240);
              ::std::__cxx11::string::operator=(local_58,anon_var_dwarf_3eb64fd + 9);
              for (local_248 = 0; uVar1 = local_248,
                  sVar9 = ::std::
                          vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
                          ::size(local_168), uVar1 < sVar9; local_248 = local_248 + 1) {
                psVar11 = in_RDX;
                pvVar8 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                       *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
                ::std::__cxx11::string::string(local_268,(string *)pvVar8);
                pvVar10 = vector<duckdb::StrTimeSpecifier,_true>::operator[]
                                    ((vector<duckdb::StrTimeSpecifier,_true> *)
                                     in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
                (**(code **)(*(long *)in_RDX + 0x10))(in_RDX,local_268,*pvVar10);
                ::std::__cxx11::string::~string(local_268);
                in_RDX = psVar11;
              }
              local_38 = local_60 + 1;
              local_68 = 4;
              ::std::__cxx11::string::~string(local_1b0);
              StrfTimeFormat::~StrfTimeFormat(in_stack_fffffffffffffc20);
              ::std::__cxx11::string::~string(local_d8);
              goto LAB_013ecb54;
            case (string *)0x14:
              local_8a = 0x1b;
              break;
            case (string *)0x15:
              local_8a = 0x23;
              break;
            case (string *)0x16:
              local_8a = 0x1c;
              break;
            case (string *)0x18:
              local_8a = 0xb;
              break;
            case (string *)0x19:
              local_8a = 0x18;
              break;
            case (string *)0x20:
              local_8a = 0;
              break;
            case (string *)0x21:
            case (string *)0x27:
              local_8a = 5;
              break;
            case (string *)0x23:
              local_8a = 3;
              break;
            case (string *)0x25:
              local_8a = 0x15;
              break;
            case (string *)0x26:
              local_8a = 0x16;
              break;
            case (string *)0x29:
              local_8a = 0x19;
              break;
            case (string *)0x2c:
              local_8a = 7;
              break;
            case (string *)0x2d:
              local_8a = 0x20;
              break;
            case (string *)0x2f:
              local_8a = 0x10;
              break;
            case (string *)0x34:
              local_8a = 0x22;
              break;
            case (string *)0x36:
              local_8a = 2;
              break;
            case (string *)0x38:
              local_8a = 9;
              break;
            case (string *)0x39:
              local_8a = 0x17;
            }
          }
          in_RDX = psVar11;
          ::std::__cxx11::string::string(local_2b0,local_58);
          (**(code **)(*(long *)psVar11 + 0x10))(psVar11,local_2b0,local_8a);
          ::std::__cxx11::string::~string(local_2b0);
          ::std::__cxx11::string::operator=(local_58,anon_var_dwarf_3eb64fd + 9);
          local_38 = local_60 + 1;
        }
      }
LAB_013ecb54:
    }
    uVar1 = ::std::__cxx11::string::size();
    if (uVar6 < uVar1) {
      ::std::__cxx11::string::size();
      ::std::__cxx11::string::substr((ulong)local_2d0,(ulong)in_RSI);
      ::std::__cxx11::string::operator+=(local_58,local_2d0);
      ::std::__cxx11::string::~string(local_2d0);
      in_stack_fffffffffffffc30 = in_RSI;
    }
    psVar11 = &local_2f0;
    ::std::__cxx11::string::string((string *)psVar11,local_58);
    AddLiteral(in_stack_fffffffffffffc30,psVar11);
    ::std::__cxx11::string::~string((string *)&local_2f0);
    ::std::__cxx11::string::string((string *)in_RDI);
LAB_013eccac:
    local_68 = 1;
    ::std::__cxx11::string::~string(local_58);
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)in_RDI,"Empty format string",(allocator *)&stack0xffffffffffffffe7);
    ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe7);
  }
  return in_RDI;
}

Assistant:

string StrTimeFormat::ParseFormatSpecifier(const string &format_string, StrTimeFormat &format) {
	if (format_string.empty()) {
		return "Empty format string";
	}
	format.format_specifier = format_string;
	format.specifiers.clear();
	format.literals.clear();
	format.numeric_width.clear();
	format.constant_size = 0;
	idx_t pos = 0;
	string current_literal;
	for (idx_t i = 0; i < format_string.size(); i++) {
		if (format_string[i] == '%') {
			if (i + 1 == format_string.size()) {
				return "Trailing format character %";
			}
			if (i > pos) {
				// push the previous string to the current literal
				current_literal += format_string.substr(pos, i - pos);
			}
			char format_char = format_string[++i];
			if (format_char == '%') {
				// special case: %%
				// set the pos for the next literal and continue
				pos = i;
				continue;
			}
			StrTimeSpecifier specifier;
			if (format_char == '-' && i + 1 < format_string.size()) {
				format_char = format_string[++i];
				switch (format_char) {
				case 'd':
					specifier = StrTimeSpecifier::DAY_OF_MONTH;
					break;
				case 'm':
					specifier = StrTimeSpecifier::MONTH_DECIMAL;
					break;
				case 'y':
					specifier = StrTimeSpecifier::YEAR_WITHOUT_CENTURY;
					break;
				case 'H':
					specifier = StrTimeSpecifier::HOUR_24_DECIMAL;
					break;
				case 'I':
					specifier = StrTimeSpecifier::HOUR_12_DECIMAL;
					break;
				case 'M':
					specifier = StrTimeSpecifier::MINUTE_DECIMAL;
					break;
				case 'S':
					specifier = StrTimeSpecifier::SECOND_DECIMAL;
					break;
				case 'j':
					specifier = StrTimeSpecifier::DAY_OF_YEAR_DECIMAL;
					break;
				default:
					return "Unrecognized format for strftime/strptime: %-" + string(1, format_char);
				}
			} else {
				switch (format_char) {
				case 'a':
					specifier = StrTimeSpecifier::ABBREVIATED_WEEKDAY_NAME;
					break;
				case 'A':
					specifier = StrTimeSpecifier::FULL_WEEKDAY_NAME;
					break;
				case 'w':
					specifier = StrTimeSpecifier::WEEKDAY_DECIMAL;
					break;
				case 'u':
					specifier = StrTimeSpecifier::WEEKDAY_ISO;
					break;
				case 'd':
					specifier = StrTimeSpecifier::DAY_OF_MONTH_PADDED;
					break;
				case 'h':
				case 'b':
					specifier = StrTimeSpecifier::ABBREVIATED_MONTH_NAME;
					break;
				case 'B':
					specifier = StrTimeSpecifier::FULL_MONTH_NAME;
					break;
				case 'm':
					specifier = StrTimeSpecifier::MONTH_DECIMAL_PADDED;
					break;
				case 'y':
					specifier = StrTimeSpecifier::YEAR_WITHOUT_CENTURY_PADDED;
					break;
				case 'Y':
					specifier = StrTimeSpecifier::YEAR_DECIMAL;
					break;
				case 'G':
					specifier = StrTimeSpecifier::YEAR_ISO;
					break;
				case 'H':
					specifier = StrTimeSpecifier::HOUR_24_PADDED;
					break;
				case 'I':
					specifier = StrTimeSpecifier::HOUR_12_PADDED;
					break;
				case 'p':
					specifier = StrTimeSpecifier::AM_PM;
					break;
				case 'M':
					specifier = StrTimeSpecifier::MINUTE_PADDED;
					break;
				case 'S':
					specifier = StrTimeSpecifier::SECOND_PADDED;
					break;
				case 'n':
					specifier = StrTimeSpecifier::NANOSECOND_PADDED;
					break;
				case 'f':
					specifier = StrTimeSpecifier::MICROSECOND_PADDED;
					break;
				case 'g':
					specifier = StrTimeSpecifier::MILLISECOND_PADDED;
					break;
				case 'z':
					specifier = StrTimeSpecifier::UTC_OFFSET;
					break;
				case 'Z':
					specifier = StrTimeSpecifier::TZ_NAME;
					break;
				case 'j':
					specifier = StrTimeSpecifier::DAY_OF_YEAR_PADDED;
					break;
				case 'U':
					specifier = StrTimeSpecifier::WEEK_NUMBER_PADDED_SUN_FIRST;
					break;
				case 'W':
					specifier = StrTimeSpecifier::WEEK_NUMBER_PADDED_MON_FIRST;
					break;
				case 'V':
					specifier = StrTimeSpecifier::WEEK_NUMBER_ISO;
					break;
				case 'c':
				case 'x':
				case 'X':
				case 'T': {
					string subformat;
					if (format_char == 'c') {
						// %c: Locale’s appropriate date and time representation.
						// we push the ISO timestamp representation here
						subformat = "%Y-%m-%d %H:%M:%S";
					} else if (format_char == 'x') {
						// %x - Locale’s appropriate date representation.
						// we push the ISO date format here
						subformat = "%Y-%m-%d";
					} else if (format_char == 'X' || format_char == 'T') {
						// %X - Locale’s appropriate time representation.
						// we push the ISO time format here
						subformat = "%H:%M:%S";
					}
					// parse the subformat in a separate format specifier
					StrfTimeFormat locale_format;
					string error = StrTimeFormat::ParseFormatSpecifier(subformat, locale_format);
					if (!error.empty()) {
						throw InternalException("Failed to bind sub-format specifier \"%s\": %s", subformat, error);
					}
					// add the previous literal to the first literal of the subformat
					locale_format.literals[0] = std::move(current_literal) + locale_format.literals[0];
					current_literal = "";
					// now push the subformat into the current format specifier
					for (idx_t i = 0; i < locale_format.specifiers.size(); i++) {
						format.AddFormatSpecifier(std::move(locale_format.literals[i]), locale_format.specifiers[i]);
					}
					pos = i + 1;
					continue;
				}
				default:
					return "Unrecognized format for strftime/strptime: %" + string(1, format_char);
				}
			}
			format.AddFormatSpecifier(std::move(current_literal), specifier);
			current_literal = "";
			pos = i + 1;
		}
	}
	// add the final literal
	if (pos < format_string.size()) {
		current_literal += format_string.substr(pos, format_string.size() - pos);
	}
	format.AddLiteral(std::move(current_literal));
	return string();
}